

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O2

bool __thiscall
icu_63::number::impl::DecimalQuantity::fitsInLong(DecimalQuantity *this,bool ignoreFraction)

{
  char *pcVar1;
  uint uVar2;
  int8_t iVar3;
  int iVar4;
  ulong uVar5;
  int32_t magnitude;
  ulong uVar6;
  
  uVar2 = this->precision;
  uVar5 = 1;
  if (uVar2 != 0) {
    if (this->scale < 0 && !ignoreFraction) {
      uVar5 = 0;
    }
    else {
      iVar4 = this->scale + uVar2 + -1;
      if ((0x11 < iVar4) && (uVar5 = 0, iVar4 == 0x12)) {
        uVar6 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar6 = uVar5;
        }
        magnitude = 0x12;
        do {
          if (uVar6 == uVar5) {
            uVar5 = (ulong)(this->flags & 1);
            goto LAB_00219d98;
          }
          iVar3 = getDigit(this,magnitude);
          magnitude = magnitude + -1;
          pcVar1 = "\t\x02\x02\x03\x03\a\x02" + uVar5;
          uVar5 = uVar5 + 1;
        } while (iVar3 == *pcVar1);
        uVar5 = (ulong)(iVar3 < *pcVar1);
      }
    }
  }
LAB_00219d98:
  return SUB81(uVar5,0);
}

Assistant:

bool DecimalQuantity::isZero() const {
    return precision == 0;
}